

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall node::anon_unknown_2::ChainImpl::isReadyToBroadcast(ChainImpl *this)

{
  long lVar1;
  ChainstateManager *pCVar2;
  byte bVar3;
  int iVar4;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  pCVar2 = (puVar5->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  if ((((pCVar2->m_blockman).m_importing._M_base._M_i & 1U) == 0) &&
     (((pCVar2->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)) {
    iVar4 = (*(this->super_Chain)._vptr_Chain[0x23])(this);
    bVar3 = (byte)iVar4 ^ 1;
  }
  else {
    bVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool isReadyToBroadcast() override { return !chainman().m_blockman.LoadingBlocks() && !isInitialBlockDownload(); }